

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_portals.cxx
# Opt level: O0

void __thiscall xray_re::xr_portal_object::save(xr_portal_object *this,xr_writer *w)

{
  ulong uVar1;
  size_type value;
  xr_writer *w_local;
  xr_portal_object *this_local;
  
  xr_custom_object::save(&this->super_xr_custom_object,w);
  xr_writer::w_chunk<unsigned_short>(w,0xfa10,&PORTAL_VERSION);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    xr_writer::w_chunk(w,0xfa30,&this->m_sector_front);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    xr_writer::w_chunk(w,0xfa40,&this->m_sector_back);
  }
  xr_writer::open_chunk(w,0xfa50);
  value = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::size
                    (&this->m_vertices);
  xr_writer::w_size_u16(w,value);
  xr_writer::w_seq<std::vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>>>
            (w,&this->m_vertices);
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_portal_object::save(xr_writer& w) const
{
	xr_custom_object::save(w);
	w.w_chunk<uint16_t>(PORTAL_CHUNK_VERSION, PORTAL_VERSION);
	if (!m_sector_front.empty())
		w.w_chunk(PORTAL_CHUNK_SECTOR_FRONT, m_sector_front);
	if (!m_sector_back.empty())
		w.w_chunk(PORTAL_CHUNK_SECTOR_BACK, m_sector_back);
	w.open_chunk(PORTAL_CHUNK_VERTICES);
	w.w_size_u16(m_vertices.size());
	w.w_seq(m_vertices);
	w.close_chunk();
}